

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  uint uVar1;
  KeyInfo *pKVar2;
  bool bVar3;
  uint uVar4;
  undefined1 *puVar5;
  u32 uVar6;
  u8 uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  Mem *pMem2;
  long in_FS_OFFSET;
  u32 s1;
  u32 szHdr1;
  int local_98;
  uint local_7c;
  MemValue local_78;
  undefined1 *local_70;
  undefined8 uStack_68;
  sqlite3 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  pMem2 = pPKey2->aMem;
  local_78.i = -1;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  if (bSkip == 0) {
    local_3c = (u32)*pKey1;
    uVar15 = 1;
    if ((char)*pKey1 < '\0') {
      bVar8 = sqlite3GetVarint32((uchar *)pKey1,&local_3c);
      uVar15 = (ulong)bVar8;
    }
    uVar14 = 0;
    uVar17 = local_3c;
  }
  else {
    local_7c = (uint)*(byte *)((long)pKey1 + 1);
    uVar15 = 2;
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar7 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),&local_7c);
      uVar15 = (ulong)(byte)(uVar7 + 1);
    }
    local_3c = (u32)*pKey1;
    if ((ulong)local_7c < 0x80) {
      uVar17 = (uint)""[local_7c];
    }
    else {
      uVar17 = local_7c - 0xc >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar14 = 1;
    uVar17 = uVar17 + local_3c;
  }
  uVar6 = local_3c;
  if ((uint)nKey1 < uVar17) {
    local_98 = 0;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x15efe,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    pPKey2->errCode = '\v';
  }
  else {
    iVar9 = 0;
    do {
      uVar12 = pMem2->flags;
      if ((uVar12 & 0x24) == 0) {
        if ((uVar12 & 8) != 0) {
          local_7c = (uint)*(byte *)((long)pKey1 + uVar15);
          if (9 < local_7c) goto LAB_001528dc;
          uVar13 = (uint)*(byte *)((long)pKey1 + uVar15);
          if (uVar13 == 0) goto LAB_00152b5f;
          if (uVar13 == 7) {
            iVar10 = serialGet7((uchar *)((ulong)uVar17 + (long)pKey1),(Mem *)&local_78);
            if (iVar10 == 0) {
              if (local_78.r < (pMem2->u).r) goto LAB_00152b5f;
              if ((pMem2->u).r < local_78.r) goto LAB_0015294a;
            }
            else {
              iVar9 = -1;
            }
          }
          else {
            sqlite3VdbeSerialGet((uchar *)((ulong)uVar17 + (long)pKey1),uVar13,(Mem *)&local_78);
            iVar9 = sqlite3IntFloatCompare(local_78.i,(pMem2->u).r);
          }
          goto LAB_00152b65;
        }
        if ((uVar12 & 2) == 0) {
          bVar8 = *(byte *)((long)pKey1 + uVar15);
          local_7c = (uint)bVar8;
          if ((uVar12 & 0x10) == 0) {
            if (((local_7c != 0) && (bVar8 != 10)) &&
               ((bVar8 != 7 ||
                (iVar10 = serialGet7((uchar *)((ulong)uVar17 + (long)pKey1),(Mem *)&local_78),
                iVar10 == 0)))) goto LAB_0015294a;
          }
          else {
            if ((char)bVar8 < '\0') {
              sqlite3GetVarint32((uchar *)(uVar15 + (long)pKey1),&local_7c);
            }
            if ((local_7c & 1) != 0 || local_7c < 0xc) goto LAB_00152b5f;
            uVar13 = local_7c - 0xc >> 1;
            if ((uint)nKey1 < uVar13 + uVar17) {
              local_98 = 0;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x15f6d,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
              pPKey2->errCode = '\v';
            }
            else if ((pMem2->flags & 0x400) == 0) {
              uVar1 = pMem2->n;
              uVar4 = uVar1;
              if ((int)uVar13 < (int)uVar1) {
                uVar4 = uVar13;
              }
              iVar10 = memcmp((void *)((ulong)uVar17 + (long)pKey1),pMem2->z,(long)(int)uVar4);
              iVar9 = uVar13 - uVar1;
              if (iVar10 != 0) {
                iVar9 = iVar10;
              }
            }
            else {
              if (local_7c - 0xc != 0) {
                uVar16 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar16 + uVar17) != '\0') {
                    iVar9 = 1;
                    goto LAB_00152d49;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar13 != uVar16);
              }
              iVar9 = uVar13 - (pMem2->u).nZero;
            }
LAB_00152d49:
            iVar10 = 1;
            if ((uint)nKey1 < uVar13 + uVar17) goto LAB_00152d58;
          }
          goto LAB_00152b65;
        }
        local_7c = (uint)*(byte *)((long)pKey1 + uVar15);
        if ((char)*(byte *)((long)pKey1 + uVar15) < '\0') {
          sqlite3GetVarint32((uchar *)(uVar15 + (long)pKey1),&local_7c);
        }
        puVar5 = uStack_68;
        if (local_7c < 0xc) goto LAB_00152b5f;
        if ((local_7c & 1) == 0) {
LAB_0015294a:
          iVar9 = 1;
          goto LAB_00152b65;
        }
        uVar13 = local_7c - 0xc >> 1;
        uStack_68 = (undefined1 *)CONCAT44(uStack_68._4_4_,uVar13);
        if ((uVar13 + uVar17 <= (uint)nKey1) &&
           (pKVar2 = pPKey2->pKeyInfo, (int)uVar14 < (int)(uint)pKVar2->nAllField)) {
          if (pKVar2->aColl[(int)uVar14] == (CollSeq *)0x0) {
            uVar1 = pMem2->n;
            uVar4 = uVar1;
            if ((int)uVar13 < (int)uVar1) {
              uVar4 = uVar13;
            }
            iVar10 = memcmp((void *)((ulong)uVar17 + (long)pKey1),pMem2->z,(long)(int)uVar4);
            iVar9 = uVar13 - uVar1;
            if (iVar10 != 0) {
              iVar9 = iVar10;
            }
          }
          else {
            uStack_68._7_1_ = SUB81(puVar5,7);
            local_60 = pKVar2->db;
            uStack_68 = (undefined1 *)
                        CONCAT26(CONCAT11(uStack_68._7_1_,pKVar2->enc),CONCAT24(2,uVar13));
            local_70 = (undefined1 *)((ulong)uVar17 + (long)pKey1);
            iVar9 = vdbeCompareMemString
                              ((Mem *)&local_78,pMem2,pKVar2->aColl[(int)uVar14],&pPKey2->errCode);
          }
          goto LAB_00152b65;
        }
        local_98 = 0;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x15f4f,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        pPKey2->errCode = '\v';
        iVar10 = 1;
        goto LAB_00152d58;
      }
      bVar8 = *(byte *)((long)pKey1 + uVar15);
      local_7c = (uint)bVar8;
      if (9 < local_7c) {
LAB_001528dc:
        iVar9 = (uint)(local_7c != 10) * 2 + -1;
        goto LAB_00152b65;
      }
      uVar13 = (uint)bVar8;
      if (uVar13 == 0) goto LAB_00152b5f;
      uVar16 = (ulong)uVar17;
      if (uVar13 == 7) {
        serialGet7((uchar *)(uVar16 + (long)pKey1),(Mem *)&local_78);
        iVar9 = sqlite3IntFloatCompare((pMem2->u).i,local_78.r);
        iVar9 = -iVar9;
        goto LAB_00152b65;
      }
      switch(bVar8) {
      case 1:
        uVar16 = (ulong)*(char *)((long)pKey1 + uVar16);
        goto LAB_00152b56;
      case 2:
        uVar11 = (long)*(char *)((long)pKey1 + uVar16) << 8;
        uVar16 = (ulong)*(byte *)((long)pKey1 + uVar16 + 1);
        break;
      case 3:
        uVar11 = (ulong)*(byte *)((long)pKey1 + uVar16 + 1) << 8 |
                 (long)*(char *)((long)pKey1 + uVar16) << 0x10;
        uVar16 = (ulong)*(byte *)((long)pKey1 + uVar16 + 2);
        break;
      case 4:
        uVar11 = (ulong)*(byte *)((long)pKey1 + uVar16 + 2) << 8 |
                 (long)(int)((uint)*(byte *)((long)pKey1 + uVar16) << 0x18) |
                 (ulong)*(byte *)((long)pKey1 + uVar16 + 1) << 0x10;
        uVar16 = (ulong)*(byte *)((long)pKey1 + uVar16 + 3);
        break;
      case 5:
        uVar13 = *(uint *)((long)pKey1 + uVar16 + 2);
        uVar11 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                        uVar13 << 0x18);
        uVar16 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar16),
                                            *(undefined1 *)((long)pKey1 + uVar16 + 1)) << 0x20;
        break;
      case 6:
        uVar16 = *(ulong *)((long)pKey1 + uVar16);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        goto LAB_00152b56;
      default:
        uVar16 = (ulong)(uVar13 - 8);
        goto LAB_00152b56;
      }
      uVar16 = uVar16 | uVar11;
LAB_00152b56:
      if ((long)uVar16 < (pMem2->u).i) {
LAB_00152b5f:
        iVar9 = -1;
      }
      else if ((pMem2->u).i < (long)uVar16) {
        iVar9 = 1;
      }
LAB_00152b65:
      if (iVar9 == 0) {
        uVar14 = uVar14 + 1;
        iVar9 = 0;
        iVar10 = 3;
        if (uVar14 != pPKey2->nField) {
          uVar16 = (ulong)local_7c;
          if (uVar16 < 0x80) {
            uVar13 = (uint)""[uVar16];
          }
          else {
            uVar13 = local_7c - 0xc >> 1;
          }
          pMem2 = pMem2 + 1;
          uVar17 = uVar17 + uVar13;
          if (uVar17 <= (uint)nKey1) {
            iVar9 = 1;
            if (0x7f < local_7c) {
              do {
                iVar9 = iVar9 + 1;
                bVar3 = 0x3fff < uVar16;
                uVar16 = uVar16 >> 7;
              } while (bVar3);
            }
            uVar13 = (int)uVar15 + iVar9;
            uVar15 = (ulong)uVar13;
            iVar10 = 0;
            if (uVar13 < uVar6) {
              iVar9 = 0;
            }
            else {
              iVar9 = 0;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x15fa0,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
              pPKey2->errCode = '\v';
              iVar10 = 1;
              local_98 = 0;
            }
          }
        }
      }
      else {
        bVar8 = pPKey2->pKeyInfo->aSortFlags[(int)uVar14];
        iVar10 = 1;
        local_98 = iVar9;
        if (bVar8 != 0) {
          if ((bVar8 & 2) != 0) {
            uVar12 = 1;
            if (local_7c != 0) {
              uVar12 = pMem2->flags & 1;
            }
            if ((bVar8 & 1) == uVar12) goto LAB_00152d58;
          }
          iVar9 = -iVar9;
          local_98 = iVar9;
        }
      }
LAB_00152d58:
    } while (iVar10 == 0);
    if (iVar10 == 3) {
      pPKey2->eqSeen = '\x01';
      local_98 = (int)pPKey2->default_rc;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_98;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        serialGet7(&aKey1[d1], &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numeric values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        if( serial_type==7 ){
          if( serialGet7(&aKey1[d1], &mem1) ){
            rc = -1;  /* mem1 is a NaN */
          }else if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }else{
            assert( rc==0 );
          }
        }else{
          sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      if( serial_type==0
       || serial_type==10
       || (serial_type==7 && serialGet7(&aKey1[d1], &mem1)!=0)
      ){
        assert( rc==0 );
      }else{
        rc = 1;
      }
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}